

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateDynamicObjectAlloc
          (Lowerer *this,Instr *newObjInstr,uint inlineSlotCount,uint slotCount,RegOpnd *newObjDst,
          Opnd *typeSrc)

{
  ScriptContextInfo *pSVar1;
  SymOpnd *src;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  int iVar3;
  DWORD DVar4;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 extraout_var;
  AddrOpnd *src_00;
  undefined4 extraout_var_00;
  IndirOpnd *pIVar5;
  RegOpnd *newObjDst_00;
  undefined4 in_register_0000000c;
  LabelInstr *insertBeforeInstr;
  uint uVar6;
  undefined1 isZeroed;
  uint uVar7;
  IndirOpnd *local_58;
  SymOpnd *tempObjectSymOpnd;
  uint local_44;
  undefined8 local_40;
  bool local_31;
  
  local_40 = CONCAT44(in_register_0000000c,slotCount);
  tempObjectSymOpnd = (SymOpnd *)typeSrc;
  local_44 = inlineSlotCount;
  local_31 = GenerateRecyclerOrMarkTempAlloc
                       (this,newObjInstr,newObjDst,HelperAllocMemForScObject,
                        (ulong)inlineSlotCount * 8 + 0x20,(SymOpnd **)&local_58);
  if (local_58 != (IndirOpnd *)0x0) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,HoistMarkTempInitPhase,sourceContextId,functionId);
    if ((!bVar2) && (this->outerMostLoopLabel != (LabelInstr *)0x0)) {
      pSVar1 = ((this->outerMostLoopLabel->super_Instr).m_func)->m_scriptContextInfo;
      iVar3 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,1);
      src_00 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var,iVar3),AddrOpndKindDynamicVtable,
                                 this->m_func,false,(Var)0x0);
      bVar2 = false;
      insertBeforeInstr = this->outerMostLoopLabel;
      goto LAB_005c9e61;
    }
  }
  pSVar1 = newObjInstr->m_func->m_scriptContextInfo;
  iVar3 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,1);
  src_00 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var_00,iVar3),AddrOpndKindDynamicVtable,
                             this->m_func,false,(Var)0x0);
  local_58 = IR::IndirOpnd::New(newObjDst,0,(src_00->super_Opnd).m_type,this->m_func,false);
  bVar2 = true;
  insertBeforeInstr = (LabelInstr *)newObjInstr;
LAB_005c9e61:
  InsertMove(&local_58->super_Opnd,&src_00->super_Opnd,&insertBeforeInstr->super_Instr,bVar2);
  DVar4 = Js::DynamicObject::GetOffsetOfType();
  src = tempObjectSymOpnd;
  pIVar5 = IR::IndirOpnd::New(newObjDst,DVar4,(tempObjectSymOpnd->super_Opnd).m_type,this->m_func,
                              false);
  InsertMove(&pIVar5->super_Opnd,&src->super_Opnd,newObjInstr,true);
  isZeroed = local_31;
  uVar7 = (uint)local_31;
  uVar6 = (uint)local_40 - local_44;
  if ((uint)local_40 < local_44 || uVar6 == 0) {
    DVar4 = Js::DynamicObject::GetOffsetOfAuxSlots();
    GenerateMemInitNull(this,newObjDst,DVar4,newObjInstr,(bool)isZeroed);
  }
  else {
    newObjDst_00 = IR::RegOpnd::New(TyUint64,this->m_func);
    local_40 = CONCAT44(local_40._4_4_,uVar7);
    GenerateRecyclerAllocAligned
              (this,HelperAllocMemForVarArray,(ulong)uVar6 << 3,newObjDst_00,newObjInstr,false);
    DVar4 = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar5 = IR::IndirOpnd::New(newObjDst,DVar4,(newObjDst_00->super_Opnd).m_type,this->m_func,false
                               );
    InsertMove(&pIVar5->super_Opnd,&newObjDst_00->super_Opnd,newObjInstr,true);
    DVar4 = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar5 = IR::IndirOpnd::New(newObjDst,DVar4,TyUint64,this->m_func,false);
    isZeroed = (undefined1)local_40;
    InsertMove(&pIVar5->super_Opnd,&newObjDst_00->super_Opnd,newObjInstr,true);
  }
  DVar4 = Js::DynamicObject::GetOffsetOfObjectArray();
  GenerateMemInitNull(this,newObjDst,DVar4,newObjInstr,(bool)isZeroed);
  return;
}

Assistant:

void
Lowerer::GenerateDynamicObjectAlloc(IR::Instr * newObjInstr, uint inlineSlotCount, uint slotCount, IR::RegOpnd * newObjDst, IR::Opnd * typeSrc)
{
    size_t headerAllocSize = sizeof(Js::DynamicObject) + inlineSlotCount * sizeof(Js::Var);
    IR::SymOpnd * tempObjectSymOpnd;
    bool isZeroed = GenerateRecyclerOrMarkTempAlloc(newObjInstr, newObjDst, IR::HelperAllocMemForScObject, headerAllocSize, &tempObjectSymOpnd);

    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        // Hoist the vtable init to the outer most loop top as it never changes
        InsertMove(tempObjectSymOpnd,
            LoadVTableValueOpnd(this->outerMostLoopLabel, VTableValue::VtableDynamicObject), this->outerMostLoopLabel, false);
    }
    else
    {
        // MOV [newObjDst + offset(vtable)], DynamicObject::vtable
        GenerateMemInit(newObjDst, 0, LoadVTableValueOpnd(newObjInstr, VTableValue::VtableDynamicObject), newObjInstr, isZeroed);
    }
    // MOV [newObjDst + offset(type)], newObjectType
    GenerateMemInit(newObjDst, Js::DynamicObject::GetOffsetOfType(), typeSrc, newObjInstr, isZeroed);

    // CALL JavascriptOperators::AllocMemForVarArray((slotCount - inlineSlotCount) * sizeof(Js::Var))
    if (slotCount > inlineSlotCount)
    {
        size_t auxSlotsAllocSize = (slotCount - inlineSlotCount) * sizeof(Js::Var);
        IR::RegOpnd* auxSlots = IR::RegOpnd::New(TyMachPtr, m_func);

        GenerateRecyclerAllocAligned(IR::HelperAllocMemForVarArray, auxSlotsAllocSize, auxSlots, newObjInstr);
        GenerateMemInit(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), auxSlots, newObjInstr, isZeroed);

        IR::IndirOpnd* newObjAuxSlots = IR::IndirOpnd::New(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func);
        this->InsertMove(newObjAuxSlots, auxSlots, newObjInstr);
    }
    else
    {
        GenerateMemInitNull(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), newObjInstr, isZeroed);
    }

    GenerateMemInitNull(newObjDst, Js::DynamicObject::GetOffsetOfObjectArray(), newObjInstr, isZeroed);
}